

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int FindMinBits_TargetCollisionShare(int nbHashes,double share)

{
  long lVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  lVar3 = 2;
  iVar2 = 1;
  do {
    if (lVar3 == 0x40) {
      return 0x40;
    }
    lVar1 = lVar3 << 0x34;
    dVar4 = EstimateNbCollisions(nbHashes,(int)lVar3);
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 1;
  } while ((double)(lVar1 + 0x3f847ae147ae147b) <= dVar4);
  return iVar2;
}

Assistant:

static int FindMinBits_TargetCollisionShare(int nbHashes, double share)
{
    int nb;
    for (nb=2; nb<64; nb++) {
        double const maxColls = (double)(1ULL << nb) * share;
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls < maxColls) return nb;
    }
    assert(0);
    return nb;
}